

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  LogFinisher local_71;
  string local_70;
  LogMessage local_50;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[5])();
  if ((char)iVar1 == '\0') {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/message.cc"
               ,0x6b);
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: IsInitialized(): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"Message of type \"");
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x13])(this);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(CONCAT44(extraout_var,iVar2) + 8))
    ;
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"\" is missing required fields: ");
    (*(this->super_MessageLite)._vptr_MessageLite[6])(&local_70,this);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_70);
    internal::LogFinisher::operator=(&local_71,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)iVar1 == '\0') {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void Message::CheckInitialized() const {
  GOOGLE_CHECK(IsInitialized())
    << "Message of type \"" << GetDescriptor()->full_name()
    << "\" is missing required fields: " << InitializationErrorString();
}